

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void buildCore(VM *vm)

{
  StringBuffer *table;
  uint uVar1;
  Method *pMVar2;
  Class *pCVar3;
  uint uVar4;
  anon_union_8_2_14f5a2bf_for_Value_1 objModule;
  Class *pCVar5;
  char *pcVar6;
  MethodBuffer *pMVar7;
  String data;
  String data_00;
  String data_01;
  String data_02;
  String data_03;
  String data_04;
  String data_05;
  String data_06;
  String data_07;
  String data_08;
  Value value;
  
  objModule.objHeader = &newObjModule(vm,(char *)0x0)->objHeader;
  value.field_1.objHeader = objModule.objHeader;
  value._0_8_ = 5;
  mapSet(vm,vm->allModules,(Value)ZEXT816(1),value);
  pCVar5 = defineClass(vm,(ObjModule *)objModule.objHeader,"object");
  vm->objectClass = pCVar5;
  table = &vm->allMethodNames;
  uVar4 = getIndexFromSymbolTable(table,"!",1);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,2);
    pcVar6[0] = '!';
    pcVar6[1] = '\0';
    data._8_8_ = 1;
    data.str = pcVar6;
    StringBufferAdd(vm,table,data);
    uVar4 = (vm->allMethodNames).count - 1;
    pCVar5 = vm->objectClass;
  }
  uVar1 = (pCVar5->methods).count;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,&pCVar5->methods,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = (pCVar5->methods).datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectNot;
  uVar4 = getIndexFromSymbolTable(table,"==(_)",5);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,6);
    builtin_strncpy(pcVar6,"==(_)",6);
    data_00._8_8_ = 5;
    data_00.str = pcVar6;
    StringBufferAdd(vm,table,data_00);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->objectClass->methods).count;
  pMVar7 = &vm->objectClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectEqual;
  uVar4 = getIndexFromSymbolTable(table,"!=(_)",5);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,6);
    builtin_strncpy(pcVar6,"!=(_)",6);
    data_01._8_8_ = 5;
    data_01.str = pcVar6;
    StringBufferAdd(vm,table,data_01);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->objectClass->methods).count;
  pMVar7 = &vm->objectClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectNotEqual;
  uVar4 = getIndexFromSymbolTable(table,"is(_)",5);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,6);
    builtin_strncpy(pcVar6,"is(_)",6);
    data_02._8_8_ = 5;
    data_02.str = pcVar6;
    StringBufferAdd(vm,table,data_02);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->objectClass->methods).count;
  pMVar7 = &vm->objectClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectIs;
  uVar4 = getIndexFromSymbolTable(table,"toString",8);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,9);
    builtin_strncpy(pcVar6,"toString",9);
    data_03._8_8_ = 8;
    data_03.str = pcVar6;
    StringBufferAdd(vm,table,data_03);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->objectClass->methods).count;
  pMVar7 = &vm->objectClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectToString;
  uVar4 = getIndexFromSymbolTable(table,"type",4);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,5);
    builtin_strncpy(pcVar6,"type",5);
    data_04._8_8_ = 4;
    data_04.str = pcVar6;
    StringBufferAdd(vm,table,data_04);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->objectClass->methods).count;
  pMVar7 = &vm->objectClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectType;
  pCVar5 = defineClass(vm,(ObjModule *)objModule.objHeader,"class");
  vm->classOfClass = pCVar5;
  bindSuperClass(vm,pCVar5,vm->objectClass);
  uVar4 = getIndexFromSymbolTable(table,"name",4);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,5);
    builtin_strncpy(pcVar6,"name",5);
    data_05._8_8_ = 4;
    data_05.str = pcVar6;
    StringBufferAdd(vm,table,data_05);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->classOfClass->methods).count;
  pMVar7 = &vm->classOfClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primClassName;
  uVar4 = getIndexFromSymbolTable(table,"supertype",9);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,10);
    builtin_strncpy(pcVar6,"supertype",10);
    data_06._8_8_ = 9;
    data_06.str = pcVar6;
    StringBufferAdd(vm,table,data_06);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->classOfClass->methods).count;
  pMVar7 = &vm->classOfClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primClassSupertype;
  uVar4 = getIndexFromSymbolTable(table,"toString",8);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,9);
    builtin_strncpy(pcVar6,"toString",9);
    data_07._8_8_ = 8;
    data_07.str = pcVar6;
    StringBufferAdd(vm,table,data_07);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (vm->classOfClass->methods).count;
  pMVar7 = &vm->classOfClass->methods;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,pMVar7,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = pMVar7->datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primClassToString;
  pCVar5 = defineClass(vm,(ObjModule *)objModule.objHeader,"objectMeta");
  bindSuperClass(vm,pCVar5,vm->classOfClass);
  uVar4 = getIndexFromSymbolTable(table,"same(_,_)",9);
  if (uVar4 == 0xffffffff) {
    pcVar6 = (char *)memManager(vm,(void *)0x0,0,10);
    builtin_strncpy(pcVar6,"same(_,_)",10);
    data_08._8_8_ = 9;
    data_08.str = pcVar6;
    StringBufferAdd(vm,table,data_08);
    uVar4 = (vm->allMethodNames).count - 1;
  }
  uVar1 = (pCVar5->methods).count;
  if (uVar1 <= uVar4) {
    MethodBufferFillWrite(vm,&pCVar5->methods,(Method)ZEXT816(0),(uVar4 - uVar1) + 1);
  }
  pMVar2 = (pCVar5->methods).datas;
  pMVar2[uVar4].type = MT_PRIMITIVE;
  pMVar2[uVar4].field_1.primFn = primObjectmetaSame;
  (vm->objectClass->objHeader).class = pCVar5;
  pCVar3 = vm->classOfClass;
  (pCVar5->objHeader).class = pCVar3;
  (pCVar3->objHeader).class = pCVar3;
  loadModule(vm,(Value)ZEXT816(1),
             "class Null {}\nclass Bool {}\nclass Num {}\nclass Fn {}\nclass Thread {}\n\nclass Sequence {\n   all(f) {\n      var result = true\n      for element (this) {\n         result = f.call(element)\n         if (!result) return result\n      }\n      return result\n   }\n\n   any(f) {\n      var result = false\n      for element (this) {\n         result = f.call(element)\n         if (result) return result\n      }\n      return result\n   }\n\n   contains(element) {\n      for item (this) if (element == item) return true\n      return false\n   }\n\n   count {\n      var result = 0\n      for element (this) result = result + 1\n      return result\n   }\n\n   count(f) {\n      var result = 0\n      for element (this) if (f.call(element)) result = result + 1\n      return result\n   }\n\n   each(f) {\n      for element (this) f.call(element)\n   }\n\n   isEmpty {\n      return iterate(null) ? false : true\n   }\n\n   map(transformation) {\n      return MapSequence.new(this, transformation)\n   }\n\n   where(predicate) {\n      return WhereSequence.new(this, predicate)\n   }\n\n   reduce(acc, f) {\n      for element (this) acc = f.call(acc, element)\n      return acc\n   }\n\n   reduce(f) {\n      var iter = iterate(null)\n      if (!iter) Thread.abort(\"Can\'t reduce an empty sequence.\")\n      var result = iteratorValue(iter)\n      while (iter = iterate(iter)) result = f.call(result, iteratorValue(iter))\n      return result\n  }\n\n   join(sep) {\n      var first = true\n      var result = \"\"\n      for element (this) {\n         if (!first) result = result + sep\n         first = false\n         result = result + element.toString\n      }\n      return result\n   }\n\n   join() {\n      return join(\"\")\n   }\n\n   toList {\n      var result = List.new()\n      for element (this) result.add(element)\n      return result\n   }\n}\n\nclass MapSequence < Sequence {\n   var sequence\n   var fn\n   new(seq, f) {\n      sequence = seq\n      fn = f\n   }\n\n  iterate(iterator) { \n     return sequence.iterate(iterator)\n  }\n  iteratorValue(iterator) {\n     return fn.call(sequence.iteratorValue(iterator))\n  }\n}\n\nclass Wher..." /* TRUNCATED STRING LITERAL */
            );
  return;
}

Assistant:

void buildCore(VM *vm) {
    // 创建核心模块
    ObjModule *coreModule = newObjModule(vm, NULL);
    mapSet(vm, vm->allModules, CORE_MODULE, OBJ_TO_VALUE(coreModule));

    // 定义object类并绑定方法
    vm->objectClass = defineClass(vm, coreModule, "object");
    PRIM_METHOD_BIND(vm->objectClass, "!", primObjectNot);
    PRIM_METHOD_BIND(vm->objectClass, "==(_)", primObjectEqual);
    PRIM_METHOD_BIND(vm->objectClass, "!=(_)", primObjectNotEqual);
    PRIM_METHOD_BIND(vm->objectClass, "is(_)", primObjectIs);
    PRIM_METHOD_BIND(vm->objectClass, "toString", primObjectToString);
    PRIM_METHOD_BIND(vm->objectClass, "type", primObjectType);

    // 定义classOfClass类,它是所有meta类的meta类和基类
    vm->classOfClass = defineClass(vm, coreModule, "class");

    // objectClass是任何类的基类
    bindSuperClass(vm, vm->classOfClass, vm->objectClass);

    PRIM_METHOD_BIND(vm->classOfClass, "name", primClassName);
    PRIM_METHOD_BIND(vm->classOfClass, "supertype", primClassSupertype);
    PRIM_METHOD_BIND(vm->classOfClass, "toString", primClassToString);

    // 定义object类的元信息类objectMetaclass, 无须挂载到vm
    Class *objectMetaclass = defineClass(vm, coreModule, "objectMeta");

    // classOfClass类是所有meta类的meta类和基类
    bindSuperClass(vm, objectMetaclass, vm->classOfClass);

    // 类型比较
    PRIM_METHOD_BIND(objectMetaclass, "same(_,_)", primObjectmetaSame);

    // 绑定各自的meta类
    vm->objectClass->objHeader.class = objectMetaclass;
    objectMetaclass->objHeader.class = vm->classOfClass;
    vm->classOfClass->objHeader.class = vm->classOfClass; // 元信息类回路,meta类终点

    // 执行核心模块
    executeModule(vm, CORE_MODULE, coreModuleCode);
}